

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

work_thread_shptr_t __thiscall
so_5::disp::active_group::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::search_and_try_remove_group_from_map
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           *this,string *group_name)

{
  _Base_ptr *pp_Var1;
  int iVar2;
  iterator __position;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  work_thread_shptr_t wVar3;
  
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t = (_func_int **)0x0;
  *(undefined8 *)&this->m_params = 0;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&group_name[3]._M_string_length);
  if (iVar2 == 0) {
    if (*(char *)&group_name[3]._M_dataplus._M_p == '\0') {
      __position = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>_>_>
                           *)&group_name[1].field_2,in_RDX);
      if ((_Base_ptr)((long)&group_name[1].field_2 + 8) != __position._M_node) {
        pp_Var1 = &__position._M_node[2]._M_left;
        *pp_Var1 = (_Base_ptr)((long)&(*pp_Var1)[-1]._M_right + 7);
        if (*pp_Var1 == (_Base_ptr)0x0) {
          (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t =
               *(_func_int ***)(__position._M_node + 2);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->m_params,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__position._M_node[2]._M_parent)
          ;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>_>_>
          ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>_>_>
                          *)&group_name[1].field_2,(const_iterator)__position._M_node);
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&group_name[3]._M_string_length);
    wVar3.
    super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = extraout_RDX._M_pi;
    wVar3.
    super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (work_thread_shptr_t)
           wVar3.
           super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

work_thread_shptr_t
		search_and_try_remove_group_from_map(
			const std::string & group_name )
			{
				work_thread_shptr_t result;

				std::lock_guard< std::mutex > lock( m_lock );

				if( !m_shutdown_started )
					{
						auto it = m_groups.find( group_name );

						if( m_groups.end() != it && 0 == --(it->second.m_user_agent) )
							{
								result = it->second.m_thread;
								m_groups.erase( it );
							}
					}

				return result;
			}